

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O2

void __thiscall Limiter::Limiter(Limiter *this,int maxRPS,int timeFramesPS)

{
  int iVar1;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  HitQueue::HitQueue(&this->hitQueue_,timeFramesPS);
  iVar1 = 0;
  if (timeFramesPS + 1U < 3) {
    iVar1 = timeFramesPS;
  }
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  Tick::Tick(&this->tick_,(microseconds)((long)iVar1 * 1000000),(function<void_()> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  this->maxRPS_ = maxRPS;
  return;
}

Assistant:

Limiter(int maxRPS, int timeFramesPS)
        : hitQueue_(timeFramesPS)
        // note that callbacks may start coming right after this
        , tick_(std::chrono::seconds(1) / timeFramesPS, [this] { OnTimeFrameBoundary(); })
        , maxRPS_(maxRPS)
    {
    }